

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O1

int __thiscall HydEngine::getTimeStep(HydEngine *this)

{
  int iVar1;
  int iVar2;
  string reason;
  
  iVar2 = (this->network->options).timeOptions[1];
  iVar1 = this->currentTime;
  std::__cxx11::string::_M_replace
            ((ulong)&this->timeStepReason,0,(char *)(this->timeStepReason)._M_string_length,0x14803a
            );
  iVar1 = (iVar1 / iVar2 + 1) * iVar2 - iVar1;
  iVar2 = this->rptTime - this->currentTime;
  if ((iVar2 != 0 && this->currentTime <= this->rptTime) && (iVar2 < iVar1)) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->timeStepReason,0,(char *)(this->timeStepReason)._M_string_length,
               0x14803a);
    iVar1 = iVar2;
  }
  iVar2 = timeToPatternChange(this,iVar1);
  iVar2 = timeToCloseTank(this,iVar2);
  iVar2 = timeToActivateControl(this,iVar2);
  return iVar2;
}

Assistant:

int HydEngine::getTimeStep()
{
    // ... normal time step is user-supplied hydraulic time step

    string reason ;
    int tstep = network->option(Options::HYD_STEP);
    int n = currentTime / tstep + 1;
    tstep = n * tstep - currentTime;
    timeStepReason = "";

    // ... adjust for time until next reporting period

    int t = rptTime - currentTime;
    if ( t > 0 && t < tstep )
    {
        tstep = t;
        timeStepReason = "";
    }

    // ... adjust for time until next time pattern change

    tstep = timeToPatternChange(tstep);

    // ... adjust for shortest time to fill or drain a tank

    tstep = timeToCloseTank(tstep);

    // ... adjust for shortest time to activate a simple control

    tstep = timeToActivateControl(tstep);
    return tstep;
}